

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v6::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  buffer<char> *pbVar10;
  uint *divisor;
  int iVar11;
  result rVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  size_t __len;
  uint64_t error;
  int iVar19;
  char cVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  uint *puVar25;
  uint64_t uVar26;
  int iVar27;
  bool bVar28;
  boundaries bVar29;
  int exp;
  fixed_handler handler;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  int local_94;
  buffer<char> *local_90;
  ulong local_88;
  uint *local_80;
  fixed_handler local_78;
  double local_60;
  ulong local_58;
  fp local_50;
  uint64_t local_40;
  float_specs local_38;
  uint *puVar20;
  
  if (value < 0.0) {
    assert_fail(in_stack_ffffffffffffff60,0,
                (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  uVar13 = (ulong)(uint)precision;
  uVar24 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar24 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      iVar11 = 0;
    }
    else {
      if (buf->capacity_ < uVar13) {
        (**buf->_vptr_buffer)(buf,uVar13);
      }
      buf->size_ = uVar13;
      memset(buf->ptr_,0x30,uVar13);
      iVar11 = -precision;
    }
  }
  else {
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar11 = snprintf_float<double>(value,precision,specs,buf);
      return iVar11;
    }
    local_94 = 0;
    local_90 = buf;
    if (precision < 0) {
      local_50.f = 0;
      local_50.e = 0;
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        local_60 = value;
        bVar29 = fp::assign_with_boundaries<double>(&local_50,value);
      }
      else {
        local_60 = value;
        bVar29 = fp::assign_float_with_boundaries<double>(&local_50,value);
      }
      if ((local_50.f >> 0x34 & 1) == 0) {
        lVar17 = 0x3f;
        if ((local_50.f & 0xfffffffffffff) != 0) {
          for (; (local_50.f & 0xfffffffffffff) >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        local_50.f = local_50.f << (~(byte)lVar17 + 0x35 & 0x3f);
        local_50.e = (local_50.e - ((uint)lVar17 ^ 0x3f)) + 0xb;
      }
      iVar11 = (int)((ulong)((long)(-0x32 - local_50.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar15 = iVar11 + 0x15b;
      uVar18 = iVar11 + 0x162;
      if (-1 < (int)uVar15) {
        uVar18 = uVar15;
      }
      uVar13 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar18 >> 3) * 8 + 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar13;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_50.f << 0xb;
      local_50.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
      iVar11 = local_50.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
               0x35;
      if (0x1c < local_50.e +
                 *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
                 0x71U) {
        local_50.e = iVar11;
        __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x43d,
                      "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar13;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = bVar29.upper;
      lVar17 = SUB168(auVar4 * auVar8,8);
      lVar23 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
      uVar16 = lVar17 + lVar23 + 1;
      local_78.buf = buf->ptr_;
      local_78._16_8_ = uVar16 - local_50.f;
      bVar14 = -(char)iVar11;
      puVar25 = (uint *)(1L << (bVar14 & 0x3f));
      uVar24 = uVar16 >> (bVar14 & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = bVar29.lower;
      local_78.size = 0;
      uVar15 = (uint)uVar24;
      local_50.e = iVar11;
      if (uVar15 == 0) goto LAB_00185a71;
      if (uVar24 >> 0x20 != 0) goto LAB_00185a89;
      local_58 = (long)puVar25 - 1;
      local_94 = 1;
      if (((((9 < uVar15) && (local_94 = 2, 99 < uVar15)) && (local_94 = 3, 999 < uVar15)) &&
          ((local_94 = 4, 9999 < uVar15 && (local_94 = 5, 99999 < uVar15)))) &&
         ((local_94 = 6, 999999 < uVar15 &&
          ((local_94 = 7, 9999999 < uVar15 && (local_94 = 8, 99999999 < uVar15)))))) {
        local_94 = 10 - (uint)(uVar15 < 1000000000);
      }
      local_88 = (ulong)((uVar18 & 0xfffffff8) + 8);
      uVar26 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar17 + lVar23 +
               2;
      uVar16 = uVar16 & local_58;
      local_80 = puVar25;
      do {
        lVar17 = (long)local_94;
        switch(local_94) {
        case 1:
          cVar21 = (char)uVar24;
          uVar24 = 0;
          goto LAB_00185887;
        case 2:
          cVar21 = (char)((uVar24 & 0xffffffff) / 10);
          iVar11 = (int)((uVar24 & 0xffffffff) / 10) * 10;
          break;
        case 3:
          cVar21 = (char)((uVar24 & 0xffffffff) / 100);
          iVar11 = (int)((uVar24 & 0xffffffff) / 100) * 100;
          break;
        case 4:
          cVar21 = (char)((uVar24 & 0xffffffff) / 1000);
          iVar11 = (int)((uVar24 & 0xffffffff) / 1000) * 1000;
          break;
        case 5:
          cVar21 = (char)((uVar24 & 0xffffffff) / 10000);
          iVar11 = (int)((uVar24 & 0xffffffff) / 10000) * 10000;
          break;
        case 6:
          uVar13 = uVar24 >> 5 & 0x7ffffff;
          cVar21 = (char)(uVar13 / 0xc35);
          iVar11 = (int)(uVar13 / 0xc35) * 100000;
          break;
        case 7:
          cVar21 = (char)((uVar24 & 0xffffffff) / 1000000);
          iVar11 = (int)((uVar24 & 0xffffffff) / 1000000) * 1000000;
          break;
        case 8:
          cVar21 = (char)((uVar24 & 0xffffffff) / 10000000);
          iVar11 = (int)((uVar24 & 0xffffffff) / 10000000) * 10000000;
          break;
        case 9:
          cVar21 = (char)((uVar24 & 0xffffffff) / 100000000);
          iVar11 = (int)((uVar24 & 0xffffffff) / 100000000) * 100000000;
          break;
        case 10:
          uVar13 = (uVar24 >> 9 & 0x7fffff) * 0x44b83;
          cVar21 = (char)(uVar13 >> 0x27);
          iVar11 = (uint)(uVar13 >> 0x27) * 1000000000;
          break;
        default:
          goto switchD_001853f6_default;
        }
        uVar24 = (ulong)(uint)((int)uVar24 - iVar11);
LAB_00185887:
        local_94 = local_94 + -1;
        in_stack_ffffffffffffff58 = 1;
        rVar12 = grisu_shortest_handler::on_digit
                           ((grisu_shortest_handler *)&local_78,cVar21 + '0',
                            *(long *)(
                                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                     + lVar17 * 8 + 0x18) << (bVar14 & 0x3f),
                            (uVar24 << (bVar14 & 0x3f)) + uVar16,uVar26,local_94,true);
        uVar13 = local_58;
        divisor = local_80;
        puVar25 = (uint *)((ulong)puVar25 & 0xffffffff);
        if (rVar12 != more) {
          puVar25 = (uint *)(ulong)rVar12;
        }
        iVar11 = (int)puVar25;
        puVar20 = &switchD_001857af::switchdataD_001cd84c;
        if (rVar12 != more) goto LAB_00185938;
      } while (0 < local_94);
      do {
        uVar24 = uVar16 * 10;
        uVar26 = uVar26 * 10;
        uVar16 = uVar24 & uVar13;
        local_94 = local_94 + -1;
        in_stack_ffffffffffffff58 = 0;
        rVar12 = grisu_shortest_handler::on_digit
                           ((grisu_shortest_handler *)&local_78,
                            (char)(uVar24 >> (bVar14 & 0x3f)) + '0',(uint64_t)divisor,uVar16,uVar26,
                            local_94,false);
        if (rVar12 != more) {
          puVar25 = (uint *)(ulong)rVar12;
        }
        iVar11 = (int)puVar25;
        puVar20 = divisor;
      } while (rVar12 == more);
LAB_00185938:
      pbVar10 = local_90;
      iVar19 = (int)puVar20;
      uVar13 = (ulong)(uint)local_78.size;
      if (iVar11 == 2) {
        local_94 = local_94 + (local_78.size - (int)local_88) + 0x15b;
        fallback_format<double>(local_60,local_90,&local_94);
        iVar19 = local_94;
      }
      else {
        if (local_78.size < 0) goto LAB_00185ac0;
        if (local_90->capacity_ < uVar13) {
          (**local_90->_vptr_buffer)(local_90,uVar13);
        }
        pbVar10->size_ = uVar13;
      }
      iVar27 = (int)local_88;
      if (iVar11 == 2) {
        return iVar19;
      }
    }
    else {
      if (0x11 < precision) {
        iVar11 = snprintf_float<double>(value,precision,specs,buf);
        return iVar11;
      }
      uVar16 = (ulong)value & 0xfffffffffffff;
      bVar28 = (ulong)value >> 0x34 == 0;
      uVar13 = uVar16 | 0x10000000000000;
      if (bVar28) {
        uVar13 = uVar16;
      }
      iVar11 = (uint)((ulong)value >> 0x34) - 0x433;
      if (bVar28) {
        lVar17 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar13 = uVar13 << (~(byte)lVar17 + 0x35 & 0x3f);
        iVar11 = -0x427 - ((uint)lVar17 ^ 0x3f);
      }
      iVar19 = (int)((ulong)((long)(-0x32 - iVar11) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar15 = iVar19 + 0x15b;
      uVar18 = iVar19 + 0x162;
      if (-1 < (int)uVar15) {
        uVar18 = uVar15;
      }
      local_88 = (ulong)(uVar18 & 0xfffffff8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar13 << 0xb;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar18 >> 3) * 8 + 8);
      uVar16 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      uVar15 = -(*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
                iVar11) - 0x35;
      local_78.buf = buf->ptr_;
      local_78.size = 0;
      bVar14 = (byte)uVar15;
      local_40 = 1L << (bVar14 & 0x3f);
      local_78.fixed = uVar24 == 0x200000000;
      local_78.exp10 = 0x154 - (uVar18 & 0xfffffff8);
      uVar13 = uVar16 >> (bVar14 & 0x3f);
      uVar18 = (uint)uVar13;
      local_78.precision = precision;
      if (uVar18 == 0) {
LAB_00185a71:
        local_78.size = 0;
        assert_fail(in_stack_ffffffffffffff60,0,
                    (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      if (uVar13 >> 0x20 != 0) {
LAB_00185a89:
        local_78.size = 0;
        assert_fail(in_stack_ffffffffffffff60,0,
                    (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      local_94 = 1;
      if ((((9 < uVar18) && (local_94 = 2, 99 < uVar18)) && (local_94 = 3, 999 < uVar18)) &&
         (((local_94 = 4, 9999 < uVar18 && (local_94 = 5, 99999 < uVar18)) &&
          ((local_94 = 6, 999999 < uVar18 &&
           ((local_94 = 7, 9999999 < uVar18 && (local_94 = 8, 99999999 < uVar18)))))))) {
        local_94 = 10 - (uint)(uVar18 < 1000000000);
      }
      local_60 = value;
      local_38 = specs;
      rVar12 = fixed_handler::on_start
                         (&local_78,
                          (&basic_data<void>::powers_of_10_64)[local_94 - 1] << (bVar14 & 0x3f),
                          uVar16 / 10,10,&local_94);
      if (rVar12 == more) {
        local_80 = (uint *)(local_40 - 1);
        uVar16 = uVar16 & (ulong)local_80;
        do {
          lVar17 = (long)local_94;
          switch(local_94) {
          case 1:
            cVar21 = (char)uVar13;
            uVar13 = 0;
            goto LAB_001854ce;
          case 2:
            cVar21 = (char)((uVar13 & 0xffffffff) / 10);
            iVar11 = (int)((uVar13 & 0xffffffff) / 10) * 10;
            break;
          case 3:
            cVar21 = (char)((uVar13 & 0xffffffff) / 100);
            iVar11 = (int)((uVar13 & 0xffffffff) / 100) * 100;
            break;
          case 4:
            cVar21 = (char)((uVar13 & 0xffffffff) / 1000);
            iVar11 = (int)((uVar13 & 0xffffffff) / 1000) * 1000;
            break;
          case 5:
            cVar21 = (char)((uVar13 & 0xffffffff) / 10000);
            iVar11 = (int)((uVar13 & 0xffffffff) / 10000) * 10000;
            break;
          case 6:
            uVar22 = uVar13 >> 5 & 0x7ffffff;
            cVar21 = (char)(uVar22 / 0xc35);
            iVar11 = (int)(uVar22 / 0xc35) * 100000;
            break;
          case 7:
            cVar21 = (char)((uVar13 & 0xffffffff) / 1000000);
            iVar11 = (int)((uVar13 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 8:
            cVar21 = (char)((uVar13 & 0xffffffff) / 10000000);
            iVar11 = (int)((uVar13 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 9:
            cVar21 = (char)((uVar13 & 0xffffffff) / 100000000);
            iVar11 = (int)((uVar13 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 10:
            uVar22 = (uVar13 >> 9 & 0x7fffff) * 0x44b83;
            cVar21 = (char)(uVar22 >> 0x27);
            iVar11 = (uint)(uVar22 >> 0x27) * 1000000000;
            break;
          default:
switchD_001853f6_default:
            assert_fail(in_stack_ffffffffffffff60,0,
                        (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          }
          uVar13 = (ulong)(uint)((int)uVar13 - iVar11);
LAB_001854ce:
          local_94 = local_94 + -1;
          in_stack_ffffffffffffff58 = 1;
          rVar12 = fixed_handler::on_digit
                             (&local_78,cVar21 + '0',
                              *(long *)(
                                       "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                       + lVar17 * 8 + 0x18) << (bVar14 & 0x3f),
                              (uVar13 << (bVar14 & 0x3f)) + uVar16,1,local_94,true);
          uVar26 = local_40;
          if (rVar12 != more) goto LAB_00185588;
        } while (0 < local_94);
        error = 1;
        local_58 = (ulong)uVar15;
        do {
          uVar13 = uVar16 * 10;
          error = error * 10;
          uVar16 = uVar13 & (ulong)local_80;
          local_94 = local_94 + -1;
          in_stack_ffffffffffffff58 = 0;
          rVar12 = fixed_handler::on_digit
                             (&local_78,(char)(uVar13 >> ((byte)local_58 & 0x3f)) + '0',uVar26,
                              uVar16,error,local_94,false);
        } while (rVar12 == more);
      }
LAB_00185588:
      pbVar10 = local_90;
      if (rVar12 == error) {
        precision = snprintf_float<double>(local_60,precision,local_38,local_90);
        iVar27 = (int)local_88;
      }
      else {
        uVar13 = (ulong)(uint)local_78.size;
        if (0 < local_78.size && uVar24 != 0x200000000) {
          uVar13 = (ulong)(uint)local_78.size;
          do {
            iVar11 = local_94 + 1;
            if (local_90->ptr_[uVar13 - 1] != '0') goto LAB_001859f0;
            bVar28 = 1 < (long)uVar13;
            uVar13 = uVar13 - 1;
            local_94 = iVar11;
          } while (bVar28);
          uVar13 = 0;
        }
LAB_001859f0:
        if ((int)uVar13 < 0) {
LAB_00185ac0:
          assert_fail(in_stack_ffffffffffffff60,0,
                      (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        }
        uVar13 = uVar13 & 0xffffffff;
        iVar27 = (int)local_88;
        if (local_90->capacity_ < uVar13) {
          (**local_90->_vptr_buffer)(local_90,uVar13);
        }
        pbVar10->size_ = uVar13;
      }
      if (rVar12 == error) {
        return precision;
      }
      iVar27 = iVar27 + 8;
    }
    iVar11 = (local_94 - iVar27) + 0x15c;
  }
  return iVar11;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}